

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O3

void flecs::_::register_lifecycle_actions<Position_const>
               (ecs_world_t *world,ecs_entity_t component,bool ctor,bool dtor,bool copy,bool move)

{
  _Bool _Var1;
  EcsComponentLifecycle cl;
  EcsComponentLifecycle local_58;
  
  _Var1 = ecs_component_has_actions(world,component);
  if (!_Var1) {
    local_58.copy = (ecs_copy_t)0x0;
    local_58.move = (ecs_move_t)0x0;
    local_58.ctor = (ecs_xtor_t)0x0;
    local_58.dtor = (ecs_xtor_t)0x0;
    local_58.ctx = (void *)0x0;
    if (ctor) {
      local_58.ctor = component_ctor<Position>;
    }
    if (dtor) {
      local_58.dtor = component_dtor<Position>;
    }
    if (copy) {
      local_58.copy = component_copy<Position>;
    }
    if (move) {
      local_58.move = component_move<Position>;
    }
    ecs_set_component_actions_w_entity(world,component,&local_58);
  }
  return;
}

Assistant:

void register_lifecycle_actions(
    ecs_world_t *world,
    ecs_entity_t component,
    bool ctor,
    bool dtor,
    bool copy,
    bool move)
{
    if (!ecs_component_has_actions(world, component)) {
        EcsComponentLifecycle cl{};
        if (ctor) {
            cl.ctor = _::component_ctor<
                typename std::remove_const<
                    typename std::remove_pointer<T>::type>::type>;
        }
        if (dtor) {
            cl.dtor = _::component_dtor<
                typename std::remove_const<
                    typename std::remove_pointer<T>::type>::type>;
        }
        if (copy) {
            cl.copy = _::component_copy<
                typename std::remove_const<
                    typename std::remove_pointer<T>::type>::type>;
        }
        if (move) {
            cl.move = _::component_move<
                typename std::remove_const<
                    typename std::remove_pointer<T>::type>::type>;
        }

        ecs_set_component_actions_w_entity( world, component, &cl);
    }
}